

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Client::Client(Client *this,char *host,int port,time_t timeout_sec)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_00186270;
  std::__cxx11::string::string((string *)&this->host_,host,(allocator *)&local_60);
  this->port_ = port;
  this->timeout_sec_ = timeout_sec;
  std::operator+(&local_60,&this->host_,":");
  std::__cxx11::to_string(&local_40,this->port_);
  std::operator+(&this->host_and_port_,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

inline Client::Client(
    const char* host, int port, time_t timeout_sec)
    : host_(host)
    , port_(port)
    , timeout_sec_(timeout_sec)
    , host_and_port_(host_ + ":" + std::to_string(port_))
{
}